

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lms.cpp
# Opt level: O0

void __thiscall CGameControllerLMS::DoWincheckRound(CGameControllerLMS *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  IServer *pIVar4;
  CGameContext *pCVar5;
  CCharacter *pCVar6;
  int iVar7;
  IGameController *in_RDI;
  int i_1;
  int AlivePlayerCount;
  CPlayer *pAlivePlayer;
  int i;
  CPlayer *in_stack_ffffffffffffffc8;
  int local_20;
  int local_1c;
  CPlayer *local_18;
  int local_c;
  
  if (0 < (in_RDI->m_GameInfo).m_TimeLimit) {
    pIVar4 = IGameController::Server(in_RDI);
    iVar2 = IServer::Tick(pIVar4);
    iVar2 = iVar2 - in_RDI->m_GameStartTick;
    iVar7 = (in_RDI->m_GameInfo).m_TimeLimit;
    pIVar4 = IGameController::Server(in_RDI);
    iVar3 = IServer::TickSpeed(pIVar4);
    iVar7 = iVar7 * iVar3;
    if (SBORROW4(iVar2,iVar7 * 0x3c) == iVar2 + iVar7 * -0x3c < 0) {
      local_c = 0;
      do {
        if (0x3f < local_c) {
          IGameController::EndRound((IGameController *)0x12e0f8);
          return;
        }
        pCVar5 = IGameController::GameServer(in_RDI);
        if (pCVar5->m_apPlayers[local_c] != (CPlayer *)0x0) {
          pCVar5 = IGameController::GameServer(in_RDI);
          iVar7 = CPlayer::GetTeam(pCVar5->m_apPlayers[local_c]);
          if (iVar7 != -1) {
            pCVar5 = IGameController::GameServer(in_RDI);
            if ((pCVar5->m_apPlayers[local_c]->m_RespawnDisabled & 1U) == 0) {
LAB_0012e0b6:
              pCVar5 = IGameController::GameServer(in_RDI);
              pCVar5->m_apPlayers[local_c]->m_Score = pCVar5->m_apPlayers[local_c]->m_Score + 1;
            }
            else {
              IGameController::GameServer(in_RDI);
              pCVar6 = CPlayer::GetCharacter(in_stack_ffffffffffffffc8);
              if (pCVar6 != (CCharacter *)0x0) {
                IGameController::GameServer(in_RDI);
                pCVar6 = CPlayer::GetCharacter(in_stack_ffffffffffffffc8);
                bVar1 = CCharacter::IsAlive(pCVar6);
                if (bVar1) goto LAB_0012e0b6;
              }
            }
          }
        }
        local_c = local_c + 1;
      } while( true );
    }
  }
  local_18 = (CPlayer *)0x0;
  local_1c = 0;
  local_20 = 0;
  do {
    if (0x3f < local_20) {
      if (local_1c == 0) {
        IGameController::EndRound((IGameController *)0x12e21a);
      }
      else if (local_1c == 1) {
        local_18->m_Score = local_18->m_Score + 1;
        IGameController::EndRound((IGameController *)0x12e241);
      }
      return;
    }
    pCVar5 = IGameController::GameServer(in_RDI);
    if (pCVar5->m_apPlayers[local_20] != (CPlayer *)0x0) {
      pCVar5 = IGameController::GameServer(in_RDI);
      iVar7 = CPlayer::GetTeam(pCVar5->m_apPlayers[local_20]);
      if (iVar7 != -1) {
        pCVar5 = IGameController::GameServer(in_RDI);
        if ((pCVar5->m_apPlayers[local_20]->m_RespawnDisabled & 1U) == 0) {
LAB_0012e1d0:
          local_1c = local_1c + 1;
          pCVar5 = IGameController::GameServer(in_RDI);
          local_18 = pCVar5->m_apPlayers[local_20];
        }
        else {
          IGameController::GameServer(in_RDI);
          pCVar6 = CPlayer::GetCharacter(in_stack_ffffffffffffffc8);
          if (pCVar6 != (CCharacter *)0x0) {
            IGameController::GameServer(in_RDI);
            pCVar6 = CPlayer::GetCharacter(in_stack_ffffffffffffffc8);
            bVar1 = CCharacter::IsAlive(pCVar6);
            if (bVar1) goto LAB_0012e1d0;
          }
        }
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void CGameControllerLMS::DoWincheckRound()
{
	// check for time based win
	if(m_GameInfo.m_TimeLimit > 0 && (Server()->Tick()-m_GameStartTick) >= m_GameInfo.m_TimeLimit*Server()->TickSpeed()*60)
	{
		for(int i = 0; i < MAX_CLIENTS; ++i)
		{
			if(GameServer()->m_apPlayers[i] && GameServer()->m_apPlayers[i]->GetTeam() != TEAM_SPECTATORS &&
				(!GameServer()->m_apPlayers[i]->m_RespawnDisabled ||
				(GameServer()->m_apPlayers[i]->GetCharacter() && GameServer()->m_apPlayers[i]->GetCharacter()->IsAlive())))
				GameServer()->m_apPlayers[i]->m_Score++;
		}

		EndRound();
	}
	else
	{
		// check for survival win
		CPlayer *pAlivePlayer = 0;
		int AlivePlayerCount = 0;
		for(int i = 0; i < MAX_CLIENTS; ++i)
		{
			if(GameServer()->m_apPlayers[i] && GameServer()->m_apPlayers[i]->GetTeam() != TEAM_SPECTATORS &&
				(!GameServer()->m_apPlayers[i]->m_RespawnDisabled ||
				(GameServer()->m_apPlayers[i]->GetCharacter() && GameServer()->m_apPlayers[i]->GetCharacter()->IsAlive())))
			{
				++AlivePlayerCount;
				pAlivePlayer = GameServer()->m_apPlayers[i];
			}
		}

		if(AlivePlayerCount == 0)		// no winner
			EndRound();
		else if(AlivePlayerCount == 1)	// 1 winner
		{
			pAlivePlayer->m_Score++;
			EndRound();
		}
	}
}